

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringDictionary.cpp
# Opt level: O1

string_view __thiscall
soul::StringDictionary::getStringForHandle(StringDictionary *this,Handle handle)

{
  uint32_t uVar1;
  pointer pIVar2;
  pointer pIVar3;
  bool bVar4;
  string_view sVar5;
  
  if (handle.handle == 0) {
    pIVar3 = (pointer)0x0;
    pIVar2 = (pointer)0x0;
  }
  else {
    pIVar2 = (this->strings).
             super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar3 = (this->strings).
             super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pIVar2 == pIVar3;
    if (!bVar4) {
      uVar1 = (pIVar2->handle).handle;
      while (uVar1 != handle.handle) {
        pIVar2 = pIVar2 + 1;
        bVar4 = pIVar2 == pIVar3;
        if (bVar4) goto LAB_001a218b;
        uVar1 = (pIVar2->handle).handle;
      }
      pIVar3 = (pointer)(pIVar2->text)._M_dataplus._M_p;
      pIVar2 = (pointer)(pIVar2->text)._M_string_length;
    }
LAB_001a218b:
    if (bVar4) {
      throwInternalCompilerError("getStringForHandle",0x35);
    }
  }
  sVar5._M_str = (char *)pIVar3;
  sVar5._M_len = (size_t)pIVar2;
  return sVar5;
}

Assistant:

std::string_view StringDictionary::getStringForHandle (Handle handle) const
    {
        if (handle == Handle())
            return {};

        for (auto& s : strings)
            if (s.handle == handle)
                return s.text;

        SOUL_ASSERT_FALSE;
        return {};
    }